

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

double Catch::Benchmark::Detail::erfc_inv(double x)

{
  double dVar1;
  
  dVar1 = anon_unknown_13::erf_inv(x);
  return dVar1;
}

Assistant:

double erfc_inv(double x) {
                return erf_inv(1.0 - x);
            }